

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Supp_Man_t * Supp_ManStart(int nChunkSize,int nStepSize)

{
  Supp_Man_t *__s;
  Vec_Ptr_t *pVVar1;
  Supp_Man_t *p;
  int nStepSize_local;
  int nChunkSize_local;
  
  __s = (Supp_Man_t *)malloc(0x28);
  memset(__s,0,0x28);
  __s->nChunkSize = nChunkSize;
  __s->nStepSize = nStepSize;
  pVVar1 = Vec_PtrAlloc(1000);
  __s->vMemory = pVVar1;
  pVVar1 = Vec_PtrAlloc(1000);
  __s->vFree = pVVar1;
  return __s;
}

Assistant:

Supp_Man_t * Supp_ManStart( int nChunkSize, int nStepSize )
{
    Supp_Man_t * p;
    p = ABC_ALLOC( Supp_Man_t, 1 );
    memset( p, 0, sizeof(Supp_Man_t) );
    p->nChunkSize = nChunkSize;
    p->nStepSize  = nStepSize;
    p->vMemory    = Vec_PtrAlloc( 1000 );
    p->vFree      = Vec_PtrAlloc( 1000 );
    return p;
}